

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int number;
  int default_value;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  EnumValueDescriptor *pEVar5;
  int *piVar6;
  int local_24;
  int32_t value;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar4,actual,field,"GetEnumValue");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"GetEnumValue",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_ENUM) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    pEVar5 = FieldDescriptor::default_value_enum(field);
    default_value = EnumValueDescriptor::number(pEVar5);
    local_24 = internal::ExtensionSet::GetEnum(this_00,number,default_value);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if ((!bVar1) || (bVar1 = HasOneofField(this,message,field), bVar1)) {
      piVar6 = GetField<int>(this,message,field);
      local_24 = *piVar6;
    }
    else {
      pEVar5 = FieldDescriptor::default_value_enum(field);
      local_24 = EnumValueDescriptor::number(pEVar5);
    }
  }
  return local_24;
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32_t value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    value = field->default_value_enum()->number();
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}